

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_setup(Curl_easy *data)

{
  uchar *plaintext;
  uint uVar1;
  connectdata *pcVar2;
  char *pcVar3;
  CURLcode CVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  uchar lm [24];
  uchar nt_hash [21];
  uchar lm_hash [21];
  uchar nt [24];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  uchar local_4a8 [32];
  uchar local_488 [32];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined2 local_44d;
  undefined3 local_44b;
  undefined4 uStack_448;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined4 uStack_43e;
  undefined2 uStack_43a;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  char local_400;
  char cStack_3ff;
  undefined4 uStack_3fe;
  undefined2 uStack_3fa;
  undefined4 uStack_3f8;
  undefined1 auStack_3f4 [964];
  
  pcVar2 = data->conn;
  sVar5 = strlen((char *)(pcVar2->proto).rtspc.buf.leng);
  sVar6 = strlen((char *)(pcVar2->proto).rtspc.buf.allc);
  uVar9 = sVar5 + sVar6 + 0x3d;
  CVar4 = CURLE_FILESIZE_EXCEEDED;
  if (uVar9 < 0x401) {
    Curl_ntlm_core_mk_lm_hash(pcVar2->passwd,local_488);
    plaintext = (pcVar2->proto).smbc.challenge;
    Curl_ntlm_core_lm_resp(local_488,plaintext,(uchar *)&local_4c8);
    Curl_ntlm_core_mk_nt_hash(pcVar2->passwd,local_4a8);
    Curl_ntlm_core_lm_resp(local_4a8,plaintext,(uchar *)&local_468);
    local_44b = 0;
    uStack_43a = 0;
    local_44d = 0xff0d;
    uStack_448 = 0x19000;
    uStack_444 = 1;
    uStack_443 = 0;
    uVar1 = (pcVar2->proto).smbc.session_key;
    uStack_442 = (undefined2)uVar1;
    uStack_440 = (undefined2)(uVar1 >> 0x10);
    uStack_438 = 0x80000;
    uStack_43e = 0x180018;
    local_430 = local_4c8;
    uStack_428 = uStack_4c0;
    local_420 = local_4b8;
    local_418 = local_468;
    uStack_410 = uStack_460;
    local_408 = local_458;
    pcVar3 = (char *)(pcVar2->proto).rtspc.buf.leng;
    strcpy(&local_400,pcVar3);
    sVar7 = strlen(pcVar3);
    pcVar3 = (char *)(pcVar2->proto).rtspc.buf.allc;
    strcpy(&cStack_3ff + sVar7,pcVar3);
    sVar8 = strlen(pcVar3);
    *(undefined4 *)((long)&uStack_3fe + sVar8 + sVar7) = 0x756e694c;
    *(undefined2 *)((long)&uStack_3fa + sVar8 + sVar7) = 0x78;
    *(undefined4 *)(auStack_3f4 + sVar8 + sVar7 + -4) = 0x6c727563;
    auStack_3f4[sVar8 + sVar7] = 0;
    uStack_438 = CONCAT26((short)uVar9,(undefined6)uStack_438);
    CVar4 = smb_send_message(data,'s',&local_44d,sVar5 + sVar6 + 0x5a);
  }
  return CVar4;
}

Assistant:

static CURLcode smb_send_setup(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_setup msg;
  char *p = msg.bytes;
  unsigned char lm_hash[21];
  unsigned char lm[24];
  unsigned char nt_hash[21];
  unsigned char nt[24];

  const size_t byte_count = sizeof(lm) + sizeof(nt) +
    strlen(smbc->user) + strlen(smbc->domain) +
    strlen(OS) + strlen(CLIENTNAME) + 4; /* 4 null chars */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  Curl_ntlm_core_mk_lm_hash(conn->passwd, lm_hash);
  Curl_ntlm_core_lm_resp(lm_hash, smbc->challenge, lm);
  Curl_ntlm_core_mk_nt_hash(conn->passwd, nt_hash);
  Curl_ntlm_core_lm_resp(nt_hash, smbc->challenge, nt);

  memset(&msg, 0, sizeof(msg) - sizeof(msg.bytes));
  msg.word_count = SMB_WC_SETUP_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.max_buffer_size = smb_swap16(MAX_MESSAGE_SIZE);
  msg.max_mpx_count = smb_swap16(1);
  msg.vc_number = smb_swap16(1);
  msg.session_key = smb_swap32(smbc->session_key);
  msg.capabilities = smb_swap32(SMB_CAP_LARGE_FILES);
  msg.lengths[0] = smb_swap16(sizeof(lm));
  msg.lengths[1] = smb_swap16(sizeof(nt));
  memcpy(p, lm, sizeof(lm));
  p += sizeof(lm);
  memcpy(p, nt, sizeof(nt));
  p += sizeof(nt);
  MSGCATNULL(smbc->user);
  MSGCATNULL(smbc->domain);
  MSGCATNULL(OS);
  MSGCATNULL(CLIENTNAME);
  DEBUGASSERT(byte_count == (size_t)(p - msg.bytes));
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(data, SMB_COM_SETUP_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}